

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::EntryResolveThenableTaskFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  JavascriptPromise *promise;
  RecyclableObject *pRVar2;
  RecyclableObject *this_00;
  ThreadContext *this_01;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  JavascriptPromiseResolveThenableTaskFunction *pJVar7;
  Recycler *alloc;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord;
  JavascriptPromiseResolveOrRejectFunction *pJVar8;
  JavascriptPromiseResolveOrRejectFunction *pJVar9;
  JavascriptMethod p_Var10;
  Var pvVar11;
  int in_stack_00000010;
  undefined1 local_90 [8];
  ArgumentReader args;
  TrackAllocData data;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  data._32_8_ = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x5e7,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b9df58;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_90,(CallInfo *)&data.line,(Var *)&stack0x00000018);
  if ((data._32_8_ & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x5e8,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00b9df58:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  pJVar7 = VarTo<Js::JavascriptPromiseResolveThenableTaskFunction,Js::RecyclableObject>(function);
  promise = (pJVar7->promise).ptr;
  pRVar2 = (pJVar7->thenable).ptr;
  this_00 = (pJVar7->thenFunction).ptr;
  args.super_Arguments.Values =
       &JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_79c5325;
  data.filename._0_4_ = 0x5f2;
  alloc = Memory::Recycler::TrackAllocInfo
                    (pSVar1->recycler,(TrackAllocData *)&args.super_Arguments.Values);
  alreadyResolvedRecord =
       (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
       new<Memory::Recycler>(1,alloc,0x51e21e);
  alreadyResolvedRecord->alreadyResolved = false;
  pJVar8 = JavascriptLibrary::CreatePromiseResolveOrRejectFunction
                     (this,EntryResolveOrRejectFunction,promise,false,alreadyResolvedRecord);
  pJVar9 = JavascriptLibrary::CreatePromiseResolveOrRejectFunction
                     (this,EntryResolveOrRejectFunction,promise,true,alreadyResolvedRecord);
  bVar4 = ScriptContext::IsScriptContextInDebugMode(pSVar1);
  bVar5 = true;
  if (bVar4) {
    bVar5 = WillRejectionBeUnhandled(promise);
    bVar5 = !bVar5;
  }
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&args.super_Arguments.Values,pSVar1,bVar5);
  this_01 = pSVar1->threadContext;
  bVar4 = this_01->reentrancySafeOrHandled;
  this_01->reentrancySafeOrHandled = true;
  ThreadContext::CheckAndResetReentrancySafeOrHandled(this_01);
  ThreadContext::AssertJsReentrancy(pSVar1->threadContext);
  p_Var10 = RecyclableObject::GetEntryPoint(this_00);
  CheckIsExecutable(this_00,p_Var10);
  p_Var10 = RecyclableObject::GetEntryPoint(this_00);
  pvVar11 = (*p_Var10)(this_00,(CallInfo)this_00,0x2000003,0,0,0,0,0x2000003,pRVar2,pJVar8,pJVar9);
  this_01->reentrancySafeOrHandled = bVar4;
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&args.super_Arguments.Values);
  return pvVar11;
}

Assistant:

Var JavascriptPromise::EntryResolveThenableTaskFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        JavascriptPromiseResolveThenableTaskFunction* resolveThenableTaskFunction = VarTo<JavascriptPromiseResolveThenableTaskFunction>(function);
        JavascriptPromise* promise = resolveThenableTaskFunction->GetPromise();
        RecyclableObject* thenable = resolveThenableTaskFunction->GetThenable();
        RecyclableObject* thenFunction = resolveThenableTaskFunction->GetThenFunction();

        JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
        alreadyResolvedRecord->alreadyResolved = false;

        JavascriptPromiseResolveOrRejectFunction* resolve = library->CreatePromiseResolveOrRejectFunction(EntryResolveOrRejectFunction, promise, false, alreadyResolvedRecord);
        JavascriptPromiseResolveOrRejectFunction* reject = library->CreatePromiseResolveOrRejectFunction(EntryResolveOrRejectFunction, promise, true, alreadyResolvedRecord);
        JavascriptExceptionObject* exception = nullptr;

        {
            bool isPromiseRejectionHandled = true;
            if (scriptContext->IsScriptContextInDebugMode())
            {
                // only necessary to determine if false if debugger is attached.  This way we'll
                // correctly break on exceptions raised in promises that result in uhandled rejections
                isPromiseRejectionHandled = !promise->WillRejectionBeUnhandled();
            }

            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext, isPromiseRejectionHandled);
            try
            {
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    return CALL_FUNCTION(scriptContext->GetThreadContext(),
                            thenFunction, Js::CallInfo(Js::CallFlags::CallFlags_Value, 3),
                            thenable,
                            resolve,
                            reject);
                }
                END_SAFE_REENTRANT_CALL
            }
            catch (const JavascriptException& err)
            {
                exception = err.GetAndClear();
            }
        }

        Assert(exception != nullptr);

        return TryRejectWithExceptionObject(exception, reject, scriptContext);
    }